

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

int ngram_search_step(ps_search_t *search,int frame_idx)

{
  ngram_search_t *ngs;
  int frame_idx_local;
  ps_search_t *search_local;
  
  if (*(char *)&search[1].name == '\0') {
    if (*(char *)((long)&search[1].name + 1) == '\0') {
      search_local._4_4_ = -1;
    }
    else {
      search_local._4_4_ = ngram_fwdflat_search((ngram_search_t *)search,frame_idx);
    }
  }
  else {
    search_local._4_4_ = ngram_fwdtree_search((ngram_search_t *)search,frame_idx);
  }
  return search_local._4_4_;
}

Assistant:

static int
ngram_search_step(ps_search_t *search, int frame_idx)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    if (ngs->fwdtree)
        return ngram_fwdtree_search(ngs, frame_idx);
    else if (ngs->fwdflat)
        return ngram_fwdflat_search(ngs, frame_idx);
    else
        return -1;
}